

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

void slang::ast::Lookup::reportUndeclared
               (Scope *initialScope,string_view name,SourceRange range,
               bitmask<slang::ast::LookupFlags> flags,bool isHierarchical,LookupResult *result)

{
  SymbolKind SVar1;
  WildcardImportData *pWVar2;
  pointer ppWVar3;
  byte bVar4;
  string_view name_00;
  string_view arg;
  string_view lookupName;
  string_view lookupName_00;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  SourceLocation SVar5;
  undefined8 this;
  bool bVar6;
  uint uVar7;
  InstanceSymbol *pIVar8;
  undefined7 extraout_var;
  Diagnostic *pDVar9;
  PackageSymbol *pPVar10;
  Diagnostic *this_00;
  DiagCode code;
  SourceLocation SVar11;
  Compilation *pCVar12;
  Symbol *source;
  InstanceSymbol *this_01;
  pointer ppWVar13;
  Scope *this_02;
  SourceRange range_00;
  string_view arg_03;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  int bestDistance;
  Symbol *closestSym;
  anon_class_16_2_6bb36380 isViable;
  anon_class_32_4_3ecd27ba checkMembers;
  size_t local_a0;
  char *local_98;
  ulong local_90;
  SourceLocation local_88;
  uint local_7c;
  long local_78;
  SourceLocation local_70;
  Compilation *local_68;
  undefined1 local_60 [24];
  SourceLocation local_48;
  Scope *local_40;
  Symbol *local_38;
  
  local_98 = name._M_str;
  local_a0 = name._M_len;
  if ((flags.m_bits & 8) != 0) {
    return;
  }
  if (((flags.m_bits & 0x10) != 0) && (bVar6 = Scope::isUninstantiated(initialScope), bVar6)) {
    return;
  }
  if (((result->flags).m_bits & 4) != 0) {
    return;
  }
  pCVar12 = initialScope->compilation;
  local_78 = 0;
  local_7c = 0x7fffffff;
  local_90 = 0;
  pIVar8 = (InstanceSymbol *)0x0;
  this_02 = initialScope;
  local_88 = range.endLoc;
  local_70 = range.startLoc;
  local_68 = pCVar12;
  do {
    local_60._0_4_ = flags.m_bits;
    local_60._8_8_ = initialScope;
    if ((flags.m_bits & 2) == 0) {
      name_00._M_str = local_98;
      name_00._M_len = local_a0;
      pIVar8 = (InstanceSymbol *)Scope::find(this_02,name_00);
      if (pIVar8 == (InstanceSymbol *)0x0) {
        pIVar8 = (InstanceSymbol *)0x0;
        goto LAB_00243144;
      }
      this_01 = pIVar8;
      if ((pIVar8->super_InstanceSymbolBase).super_Symbol.kind == TransparentMember) {
        this_01 = (InstanceSymbol *)(pIVar8->super_InstanceSymbolBase).arrayPath._M_ptr;
      }
      if ((local_60._0_4_ & Root) != Unknown) {
        bVar6 = Symbol::isType((Symbol *)this_01);
        if (((!bVar6) &&
            (SVar1 = (this_01->super_InstanceSymbolBase).super_Symbol.kind, SVar1 != TypeParameter))
           && (SVar1 != GenericClassDef)) goto LAB_00243271;
LAB_00243218:
        uVar7 = (this_01->super_InstanceSymbolBase).super_Symbol.kind - Variable;
        if (uVar7 < 0x19) {
          if ((0x1800c0fU >> (uVar7 & 0x1f) & 1) == 0) {
            if (uVar7 != 4) goto LAB_00243239;
            bVar4 = *(byte *)((long)&this_01[1].super_InstanceSymbolBase.arrayPath._M_ptr + 4) & 8;
          }
          else {
            bVar4 = *(byte *)((long)&this_01[2].body + 4) & 2;
          }
          if (bVar4 != 0) goto LAB_00243271;
        }
LAB_00243239:
        bVar6 = isVisibleFrom((Symbol *)this_01,(Scope *)local_60._8_8_);
        local_90 = CONCAT71(extraout_var,bVar6);
        goto LAB_0024324b;
      }
      uVar7 = (this_01->super_InstanceSymbolBase).super_Symbol.kind - Instance;
      if (uVar7 < 0x28) {
        if ((0x8300420004U >> ((ulong)uVar7 & 0x3f) & 1) != 0) goto LAB_00243218;
        if ((ulong)uVar7 != 0) goto LAB_0024320a;
        bVar6 = InstanceSymbol::isInterface(this_01);
      }
      else {
LAB_0024320a:
        bVar6 = Symbol::isValue((Symbol *)this_01);
      }
      if (bVar6 != false) goto LAB_00243218;
LAB_00243271:
      bVar6 = false;
      local_90 = 0;
    }
    else {
LAB_00243144:
      if (pCVar12->typoCorrections < (pCVar12->options).typoCorrectionLimit) {
        local_60._16_8_ = local_60;
        local_48 = (SourceLocation)&local_a0;
        local_40 = (Scope *)&local_7c;
        local_38 = (Symbol *)&local_78;
        reportUndeclared::anon_class_32_4_3ecd27ba::operator()
                  ((anon_class_32_4_3ecd27ba *)(local_60 + 0x10),this_02);
        pWVar2 = this_02->importData;
        pCVar12 = local_68;
        if (pWVar2 != (WildcardImportData *)0x0) {
          ppWVar3 = (pWVar2->wildcardImports).
                    super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppWVar13 = (pWVar2->wildcardImports).
                          super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; pCVar12 = local_68,
              ppWVar13 != ppWVar3; ppWVar13 = ppWVar13 + 1) {
            pPVar10 = WildcardImportSymbol::getPackage(*ppWVar13);
            if (pPVar10 != (PackageSymbol *)0x0) {
              reportUndeclared::anon_class_32_4_3ecd27ba::operator()
                        ((anon_class_32_4_3ecd27ba *)(local_60 + 0x10),&pPVar10->super_Scope);
            }
          }
        }
      }
      this_02 = this_02->thisSym->parentScope;
      if (this_02 == (Scope *)0x0) {
LAB_0024324b:
        bVar6 = false;
      }
      else {
        bVar6 = this_02->thisSym->kind != CompilationUnit || (flags.m_bits >> 0xe & 1) == 0;
      }
    }
  } while (bVar6);
  if ((local_90 & 1) != 0) {
    range_01.endLoc = local_88;
    range_01.startLoc = local_70;
    pDVar9 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,(DiagCode)0x3e000a,range_01
                             );
    arg._M_str = local_98;
    arg._M_len = local_a0;
    Diagnostic::operator<<(pDVar9,arg);
    SVar11 = (pIVar8->super_InstanceSymbolBase).super_Symbol.location;
LAB_002432ca:
    Diagnostic::addNote(pDVar9,(DiagCode)0x50001,SVar11);
    return;
  }
  lookupName._M_str = local_98;
  lookupName._M_len = local_a0;
  Compilation::tryGetDefinition
            ((DefinitionLookupResult *)(local_60 + 0x10),pCVar12,lookupName,initialScope);
  this = local_60._16_8_;
  pCVar12 = local_68;
  if (((DefinitionSymbol *)local_60._16_8_ == (DefinitionSymbol *)0x0) ||
     (((Symbol *)local_60._16_8_)->kind != Definition)) {
    lookupName_00._M_str = local_98;
    lookupName_00._M_len = local_a0;
    pPVar10 = Compilation::getPackage(local_68,lookupName_00);
    SVar5 = local_70;
    SVar11 = local_88;
    if (pPVar10 != (PackageSymbol *)0x0) {
      pDVar9 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,(DiagCode)0x33000a,
                                local_88);
      arg_00._M_str = local_98;
      arg_00._M_len = local_a0;
      pDVar9 = Diagnostic::operator<<(pDVar9,arg_00);
      range_00.endLoc = SVar11;
      range_00.startLoc = SVar5;
      Diagnostic::operator<<(pDVar9,range_00);
      return;
    }
    pCVar12->typoCorrections = pCVar12->typoCorrections + 1;
    if ((0 < (int)local_7c && local_78 != 0) && (2 < local_a0 / local_7c)) {
      range_02.endLoc = local_88;
      range_02.startLoc = local_70;
      pDVar9 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,(DiagCode)0x32000a,
                                range_02);
      arg_01._M_str = local_98;
      arg_01._M_len = local_a0;
      this_00 = Diagnostic::operator<<(pDVar9,arg_01);
      Diagnostic::operator<<(this_00,*(string_view *)(local_78 + 8));
      SVar11 = *(SourceLocation *)(local_78 + 0x18);
      goto LAB_002432ca;
    }
    source = initialScope->thisSym;
    code.subsystem = Lookup;
    code.code = 0x34;
  }
  else {
    if (!isHierarchical) {
      range_04.endLoc = local_88;
      range_04.startLoc = local_70;
      pDVar9 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,
                                (DiagCode)((uint)((flags.m_bits & 1) == 0) << 0x10 | 0x6000a),
                                range_04);
      arg_02._M_str = local_98;
      arg_02._M_len = local_a0;
      pDVar9 = Diagnostic::operator<<(pDVar9,arg_02);
      arg_03 = DefinitionSymbol::getArticleKindString((DefinitionSymbol *)this);
      goto LAB_002434b5;
    }
    source = initialScope->thisSym;
    code.subsystem = Lookup;
    code.code = 5;
  }
  range_03.endLoc = local_88;
  range_03.startLoc = local_70;
  pDVar9 = Diagnostics::add(&result->diagnostics,source,code,range_03);
  arg_03._M_str = local_98;
  arg_03._M_len = local_a0;
LAB_002434b5:
  Diagnostic::operator<<(pDVar9,arg_03);
  return;
}

Assistant:

void Lookup::reportUndeclared(const Scope& initialScope, std::string_view name, SourceRange range,
                              bitmask<LookupFlags> flags, bool isHierarchical,
                              LookupResult& result) {
    // If the caller doesn't want an error, don't give him one.
    if (flags.has(LookupFlags::NoUndeclaredError) ||
        (flags.has(LookupFlags::NoUndeclaredErrorIfUninstantiated) &&
         initialScope.isUninstantiated())) {
        return;
    }

    // If we observed a wildcard import we couldn't resolve, we shouldn't report an
    // error for an undeclared identifier because maybe it's supposed to come from that package.
    // In particular it's important that we do this because when we first look at a
    // definition because it's possible we haven't seen the file containing the package yet.
    // This also gets set for class scopes that have an error base class.
    if (result.flags.has(LookupResultFlags::SuppressUndeclared))
        return;

    // The symbol wasn't found, so this is an error. The only question is how helpful we can
    // make that error. Let's try to find the closest named symbol in all reachable scopes,
    // including package imports, to provide a "did you mean" diagnostic. If along the way
    // we happen to actually find the symbol but it's declared later in the source text,
    // we will use that to issue a "used before declared" diagnostic.
    auto& comp = initialScope.getCompilation();
    const Symbol* actualSym = nullptr;
    const Symbol* closestSym = nullptr;
    int bestDistance = INT_MAX;
    bool usedBeforeDeclared = false;
    auto scope = &initialScope;
    while (true) {
        // This lambda returns true if the given symbol is a viable candidate
        // for the kind of lookup that was being performed.
        auto isViable = [flags, &initialScope](const Symbol& sym) {
            const Symbol* s = &sym;
            if (s->kind == SymbolKind::TransparentMember)
                s = &s->as<TransparentMemberSymbol>().wrapped;

            if (flags.has(LookupFlags::Type)) {
                if (!s->isType() && s->kind != SymbolKind::TypeParameter &&
                    s->kind != SymbolKind::GenericClassDef) {
                    return false;
                }
            }
            else {
                switch (s->kind) {
                    case SymbolKind::Subroutine:
                    case SymbolKind::InstanceArray:
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                    case SymbolKind::Checker:
                    case SymbolKind::UninstantiatedDef:
                        break;
                    case SymbolKind::Instance:
                        if (!s->as<InstanceSymbol>().isInterface())
                            return false;
                        break;
                    default:
                        if (!s->isValue())
                            return false;
                        break;
                }
            }

            // Ignore special members.
            if (s->kind == SymbolKind::Subroutine &&
                s->as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
                return false;
            }

            if (VariableSymbol::isKind(s->kind) &&
                s->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {
                return false;
            }

            if (!isVisibleFrom(*s, initialScope))
                return false;

            return true;
        };

        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            actualSym = scope->find(name);
            if (actualSym) {
                usedBeforeDeclared = isViable(*actualSym);
                break;
            }
        }

        // Only check for typos if that functionality is enabled -- it can be
        // disabled by config or if we've tried too many times to correct typos.
        if (comp.doTypoCorrection()) {
            auto checkMembers = [&](const Scope& toCheck) {
                for (auto& member : toCheck.members()) {
                    if (member.name.empty() || !isViable(member))
                        continue;

                    int dist = editDistance(member.name, name, /* allowReplacements */ true,
                                            bestDistance);
                    if (dist < bestDistance) {
                        closestSym = &member;
                        bestDistance = dist;
                    }
                }
            };

            // Check the current scope.
            checkMembers(*scope);

            // Also search in package imports.
            if (auto importData = scope->getWildcardImportData()) {
                for (auto import : importData->wildcardImports) {
                    auto package = import->getPackage();
                    if (package)
                        checkMembers(*package);
                }
            }
        }

        scope = scope->asSymbol().getParentScope();
        if (!scope || (scope->asSymbol().kind == SymbolKind::CompilationUnit &&
                       flags.has(LookupFlags::DisallowUnitReferences))) {
            break;
        }
    }

    // If we found the actual named symbol and it's viable for our kind of lookup,
    // report a diagnostic about it being used before declared.
    if (usedBeforeDeclared) {
        auto& diag = result.addDiag(initialScope, diag::UsedBeforeDeclared, range);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, actualSym->location);
        return;
    }

    // Otherwise, check if this names a definition, in which case we can give a nicer error.
    if (auto def = comp.tryGetDefinition(name, initialScope).definition;
        def && def->kind == SymbolKind::Definition) {
        if (isHierarchical) {
            result.addDiag(initialScope, diag::CouldNotResolveHierarchicalPath, range) << name;
        }
        else {
            auto code = flags.has(LookupFlags::Type) ? diag::DefinitionUsedAsType
                                                     : diag::DefinitionUsedAsValue;
            result.addDiag(initialScope, code, range)
                << name << def->as<DefinitionSymbol>().getArticleKindString();
        }
        return;
    }

    // Also check for a package with this name.
    if (comp.getPackage(name)) {
        result.addDiag(initialScope, diag::UndeclaredButFoundPackage, range.end()) << name << range;
        return;
    }

    // Count the number of times we've performed typo correction.
    comp.didTypoCorrection();

    // See if we found a viable symbol with a name that's somewhat close to the one we wanted.
    // If we did, assume that the user made a typo and report it.
    if (closestSym && bestDistance > 0 && name.length() / size_t(bestDistance) >= 3) {
        auto& diag = result.addDiag(initialScope, diag::TypoIdentifier, range);
        diag << name << closestSym->name;
        diag.addNote(diag::NoteDeclarationHere, closestSym->location);
        return;
    }

    // We couldn't make any sense of this, just report a simple error about a missing identifier.
    result.addDiag(initialScope, diag::UndeclaredIdentifier, range) << name;
}